

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_makeArray
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  size_t i;
  size_t sVar2;
  undefined6 in_register_00000032;
  int32_t offset;
  
  if (-1 < resultOperand) {
    sysbvm_jit_x86_jitLoadContextInRegister
              (jit,(sysbvm_x86_register_t)CONCAT62(in_register_00000032,resultOperand));
    sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG1,(int32_t)elementCount);
    sysbvm_jit_x86_call(jit,sysbvm_array_create);
    offset = 0x10;
    uVar1 = extraout_RDX;
    for (sVar2 = 0; elementCount != sVar2; sVar2 = sVar2 + 1) {
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[sVar2]);
      sysbvm_jit_x86_mov64IntoMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,offset,SYSBVM_X86_64_ARG2);
      offset = offset + 8;
      uVar1 = extraout_RDX_00;
    }
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,(sysbvm_x86_register_t)uVar1);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeArray(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_array_create);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RAX, (int32_t)(sizeof(sysbvm_tuple_header_t) + i * sizeof(void*)), SYSBVM_X86_64_ARG2);
    }

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}